

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetFilePrefix
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  ArtifactType artifact_00;
  bool bVar1;
  char *__s;
  undefined1 local_a8 [8];
  string base;
  string suffix;
  allocator<char> local_51;
  string local_50;
  char *local_30;
  char *prefix_1;
  string *psStack_20;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  string *prefix;
  
  prefix_1._4_4_ = artifact;
  psStack_20 = config;
  config_local = (string *)this;
  this_local = (cmGeneratorTarget *)__return_storage_ptr__;
  bVar1 = IsImported(this);
  artifact_00 = prefix_1._4_4_;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"",&local_51);
    __s = GetFilePrefixInternal(this,artifact_00,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
    suffix.field_2._M_local_buf[10] = '\0';
    local_30 = __s;
    if (__s == (char *)0x0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__);
    }
    else {
      std::allocator<char>::allocator();
      suffix.field_2._M_local_buf[10] = '\x01';
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,
                 (allocator<char> *)(suffix.field_2._M_local_buf + 0xb));
    }
    if ((suffix.field_2._M_local_buf[10] & 1U) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)(suffix.field_2._M_local_buf + 0xb));
    }
  }
  else {
    suffix.field_2._M_local_buf[9] = '\0';
    std::__cxx11::string::string((string *)__return_storage_ptr__);
    std::__cxx11::string::string((string *)(base.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_a8);
    GetFullNameInternal(this,psStack_20,prefix_1._4_4_,__return_storage_ptr__,(string *)local_a8,
                        (string *)(base.field_2._M_local_buf + 8));
    suffix.field_2._M_local_buf[9] = '\x01';
    std::__cxx11::string::~string((string *)local_a8);
    std::__cxx11::string::~string((string *)(base.field_2._M_local_buf + 8));
    if ((suffix.field_2._M_local_buf[9] & 1U) == 0) {
      std::__cxx11::string::~string((string *)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetFilePrefix(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  if (this->IsImported()) {
    const char* prefix = this->GetFilePrefixInternal(artifact);

    return prefix ? prefix : std::string();
  }

  std::string prefix, suffix, base;
  this->GetFullNameInternal(config, artifact, prefix, base, suffix);
  return prefix;
}